

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O1

size_t tool_header_cb(char *ptr,size_t size,size_t nmemb,void *userdata)

{
  HdrCbData *hdrcbdata;
  OutStruct *outs;
  byte bVar1;
  char cVar2;
  undefined8 uVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 uVar10;
  void *pvVar11;
  char *pcVar12;
  long lVar13;
  FILE *pFVar14;
  ulong __n;
  ulong uVar15;
  size_t __n_00;
  byte *pbVar16;
  size_t unaff_R13;
  byte *pbVar17;
  long lVar18;
  void *__src;
  bool bVar19;
  char *scheme_1;
  long response;
  char *scheme;
  void *local_58;
  undefined8 local_50;
  char *local_48;
  long local_40;
  char *local_38;
  
  local_38 = (char *)0x0;
  if (*(long *)((long)userdata + 0x10) == 0) {
    return 0xffffffff;
  }
  __n = nmemb * size;
  if ((*(long *)(*(long *)((long)userdata + 0x10) + 0xe0) != 0) &&
     (*(FILE **)((long)userdata + 0x108) != (FILE *)0x0)) {
    sVar7 = fwrite(ptr,size,nmemb,*(FILE **)((long)userdata + 0x108));
    if (sVar7 == __n) {
      iVar5 = fflush(*(FILE **)((long)userdata + 0x108));
      if (iVar5 == 0) {
        bVar19 = true;
        sVar7 = unaff_R13;
      }
      else {
        bVar19 = false;
        errorf(*(GlobalConfig **)(*(long *)((long)userdata + 0x10) + 0x528),
               "Failed writing headers to %s",
               *(undefined8 *)(*(long *)((long)userdata + 0x10) + 0xe0));
        sVar7 = 0xffffffff;
      }
    }
    else {
      bVar19 = false;
    }
    unaff_R13 = sVar7;
    if (!bVar19) {
      return sVar7;
    }
  }
  hdrcbdata = (HdrCbData *)((long)userdata + 0x148);
  outs = (OutStruct *)((long)userdata + 0xd0);
  curl_easy_getinfo(*(undefined8 *)((long)userdata + 0x20),0x100031,&local_38);
  local_38 = proto_token(local_38);
  if ((local_38 == proto_http) || (local_38 == proto_https)) {
    local_40 = 0;
    curl_easy_getinfo(*(undefined8 *)((long)userdata + 0x20),0x200002,&local_40);
    bVar19 = true;
    if (local_40 - 200U < 200) {
      pbVar16 = (byte *)(ptr + __n);
      if (((*(long *)(*(long *)((long)userdata + 0x10) + 0x300) == 0) ||
          (*(long *)((long)userdata + 0x130) == 0)) ||
         (iVar5 = curl_strnequal(ptr,"etag:",5), iVar5 == 0)) {
        if (*(char *)((long)userdata + 0x178) == '\x01') {
          if ((0x14 < __n) && (iVar5 = curl_strnequal(ptr,"Content-disposition:",0x14), iVar5 != 0))
          {
            pbVar17 = (byte *)(ptr + 0x14);
            do {
              for (; ((pbVar17 < pbVar16 && (*pbVar17 != 0)) &&
                     ((byte)((*pbVar17 & 0xdf) + 0xa5) < 0xe6)); pbVar17 = pbVar17 + 1) {
              }
              iVar5 = 6;
              if (pbVar17 <= pbVar16 + -9) {
                if (pbVar17[8] == 0x3d && *(long *)pbVar17 == 0x656d616e656c6966) {
                  pbVar17 = pbVar17 + 9;
                  pcVar12 = (char *)malloc((size_t)(ptr + (__n - (long)pbVar17) + 1));
                  if (pcVar12 == (char *)0x0) {
                    pcVar12 = (char *)0x0;
                  }
                  else {
                    memcpy(pcVar12,pbVar17,(size_t)(ptr + (__n - (long)pbVar17)));
                    pcVar12[(long)(ptr + (__n - (long)pbVar17))] = '\0';
                    cVar2 = *pcVar12;
                    if ((cVar2 == '\'') || (iVar5 = 0x3b, pcVar9 = pcVar12, cVar2 == '\"')) {
                      iVar5 = (int)cVar2;
                      pcVar9 = pcVar12 + 1;
                    }
                    pcVar8 = strchr(pcVar9,iVar5);
                    if (pcVar8 != (char *)0x0) {
                      *pcVar8 = '\0';
                    }
                    pcVar8 = strrchr(pcVar9,0x2f);
                    if (pcVar8 == (char *)0x0) {
LAB_0010b545:
                      pcVar8 = strrchr(pcVar9,0x5c);
                      if (pcVar8 != (char *)0x0) {
                        if (pcVar8[1] == '\0') goto LAB_0010b5ca;
                        pcVar9 = pcVar8 + 1;
                      }
                      pcVar8 = strchr(pcVar9,0xd);
                      if (pcVar8 != (char *)0x0) {
                        *pcVar8 = '\0';
                      }
                      pcVar8 = strchr(pcVar9,10);
                      if (pcVar8 != (char *)0x0) {
                        *pcVar8 = '\0';
                      }
                      if (pcVar12 != pcVar9) {
                        sVar7 = strlen(pcVar9);
                        memmove(pcVar12,pcVar9,sVar7 + 1);
                      }
                    }
                    else {
                      if (pcVar8[1] != '\0') {
                        pcVar9 = pcVar8 + 1;
                        goto LAB_0010b545;
                      }
LAB_0010b5ca:
                      free(pcVar12);
                      pcVar12 = (char *)0x0;
                    }
                  }
                  iVar5 = 6;
                  if (pcVar12 != (char *)0x0) {
                    if (*(long *)((long)userdata + 0xe0) == 0) {
                      lVar13 = *(long *)(*(long *)((long)userdata + 0x10) + 0xd8);
                      if (lVar13 == 0) {
                        outs->filename = pcVar12;
LAB_0010b65f:
                        *(undefined4 *)((long)userdata + 0xd8) = 0x10101;
                        *(undefined1 *)((long)userdata + 0x178) = 0;
                        _Var4 = tool_create_output_file
                                          (outs,*(OperationConfig **)((long)userdata + 0x10));
                        if (_Var4) {
                          iVar6 = tool_write_headers(hdrcbdata,*(FILE **)((long)userdata + 0xe0));
                          iVar5 = 6;
                          if (iVar6 == 0) goto LAB_0010b469;
                          goto LAB_0010b605;
                        }
                      }
                      else {
                        pcVar9 = (char *)curl_maprintf("%s/%s",lVar13,pcVar12);
                        outs->filename = pcVar9;
                        free(pcVar12);
                        if (pcVar9 != (char *)0x0) goto LAB_0010b65f;
                      }
                      iVar5 = 1;
                      unaff_R13 = 0xffffffff;
                    }
                    else {
                      free(pcVar12);
LAB_0010b605:
                      iVar5 = 1;
                      unaff_R13 = 0xffffffff;
                    }
                  }
                }
                else {
                  while( true ) {
                    if ((pbVar16 <= pbVar17) || (*pbVar17 == 0)) goto LAB_0010b469;
                    if (*pbVar17 == 0x3b) break;
                    pbVar17 = pbVar17 + 1;
                  }
                  iVar5 = 7;
                }
              }
LAB_0010b469:
            } while (iVar5 == 7);
            if (iVar5 == 6) {
              if ((*(long *)((long)userdata + 0xe0) != 0) ||
                 (_Var4 = tool_create_output_file(outs,*(OperationConfig **)((long)userdata + 0x10))
                 , _Var4)) {
                iVar5 = tool_write_headers(hdrcbdata,*(FILE **)((long)userdata + 0xe0));
                bVar19 = iVar5 == 0;
                if (!bVar19) {
                  unaff_R13 = 0xffffffff;
                }
              }
              else {
                bVar19 = false;
                unaff_R13 = 0xffffffff;
              }
            }
            else {
              bVar19 = false;
            }
            if (!bVar19) {
              bVar19 = false;
              goto LAB_0010b843;
            }
          }
          bVar19 = true;
          if ((*(char *)((long)userdata + 0x178) == '\x01') &&
             (*(char *)(*(long *)((long)userdata + 0x150) + 0x1e7) == '\x01')) {
            pvVar11 = (void *)curl_maprintf("%.*s",__n & 0xffffffff,ptr);
            uVar3 = *(undefined8 *)((long)userdata + 0x170);
            if (pvVar11 == (void *)0x0) {
              curl_slist_free_all(uVar3);
              *(undefined8 *)((long)userdata + 0x170) = 0;
            }
            else {
              uVar10 = curl_slist_append(uVar3,pvVar11);
              *(undefined8 *)((long)userdata + 0x170) = uVar10;
              free(pvVar11);
              if (*(long *)((long)userdata + 0x170) != 0) {
                bVar19 = false;
                unaff_R13 = __n;
                goto LAB_0010b843;
              }
              curl_slist_free_all(uVar3);
            }
            bVar19 = false;
            unaff_R13 = 0xffffffff;
          }
        }
      }
      else if (pbVar16[-1] == 10) {
        pbVar16 = pbVar16 + -1;
        sVar7 = __n - 5;
        for (pbVar17 = (byte *)(ptr + 5);
            ((*pbVar17 == 0x20 || (*pbVar17 == 9)) && (pbVar17 < pbVar16)); pbVar17 = pbVar17 + 1) {
          sVar7 = sVar7 - 1;
        }
        for (; ((bVar1 = *pbVar16, bVar1 == 9 || (bVar1 == 0x20)) || ((byte)(bVar1 - 10) < 4));
            pbVar16 = pbVar16 + -1) {
          sVar7 = sVar7 - 1;
        }
        if (pbVar16 < pbVar17) {
          bVar19 = true;
        }
        else {
          iVar5 = fileno(*(FILE **)((long)userdata + 0x130));
          iVar5 = ftruncate64(iVar5,0);
          bVar19 = iVar5 == 0;
          if (bVar19) {
            fwrite(pbVar17,size,sVar7,*(FILE **)((long)userdata + 0x130));
            fputc(10,*(FILE **)((long)userdata + 0x130));
            fflush(*(FILE **)((long)userdata + 0x130));
          }
          else {
            unaff_R13 = 0xffffffff;
          }
        }
      }
    }
LAB_0010b843:
    if (!bVar19) {
      return unaff_R13;
    }
  }
  lVar13 = *(long *)((long)userdata + 0x150);
  if (*(long *)(lVar13 + 0x358) != 0) {
    pvVar11 = memchr(ptr,0x3a,__n);
    if (pvVar11 == (void *)0x0) {
      if ((*ptr == '\r') || (*ptr == '\n')) {
        *(undefined1 *)((long)userdata + 0x1da) = 1;
      }
    }
    else {
      if (*(char *)((long)userdata + 0x1da) == '\x01') {
        *(undefined8 *)((long)userdata + 0x180) = 0;
      }
      *(undefined1 *)((long)userdata + 0x1da) = 0;
      *(long *)((long)userdata + 0x180) = *(long *)((long)userdata + 0x180) + 1;
    }
  }
  if (*(char *)(lVar13 + 0x1e7) != '\x01') {
    return __n;
  }
  if ((((local_38 != proto_http) && (local_38 != proto_https)) && (local_38 != proto_rtsp)) &&
     (local_38 != proto_file)) {
    return __n;
  }
  if ((*(long *)((long)userdata + 0xe0) == 0) &&
     (_Var4 = tool_create_output_file(outs,*(OperationConfig **)((long)userdata + 0x10)), !_Var4)) {
    bVar19 = false;
    unaff_R13 = 0xffffffff;
    goto LAB_0010bb77;
  }
  if ((hdrcbdata->global->isatty == true) && (hdrcbdata->global->styled_output == true)) {
    pvVar11 = memchr(ptr,0x3a,__n);
  }
  else {
    pvVar11 = (void *)0x0;
  }
  if (pvVar11 == (void *)0x0) {
    pFVar14 = *(FILE **)((long)userdata + 0xe0);
    sVar7 = __n;
  }
  else {
    uVar15 = (long)pvVar11 - (long)ptr;
    curl_mfprintf(*(undefined8 *)((long)userdata + 0xe0),"\x1b[1m%.*s\x1b[0m:",uVar15 & 0xffffffff,
                  ptr);
    iVar5 = curl_strnequal("Location",ptr,uVar15);
    if (iVar5 != 0) {
      uVar3 = *(undefined8 *)((long)userdata + 0x20);
      pFVar14 = *(FILE **)((long)userdata + 0xe0);
      pvVar11 = (void *)((long)pvVar11 + 1);
      sVar7 = ~uVar15 + __n;
      local_40 = 0;
      local_48 = (char *)0x0;
      local_50 = 0;
      pcVar12 = getenv("VTE_VERSION");
      if (pcVar12 == (char *)0x0) {
LAB_0010b9f3:
        __n_00 = sVar7;
        uVar15 = 0;
        __src = pvVar11;
        if (sVar7 != 0) {
          __src = (void *)((long)pvVar11 + sVar7);
          uVar15 = 0;
          do {
            if ((*(char *)((long)pvVar11 + uVar15) != ' ') &&
               (*(char *)((long)pvVar11 + uVar15) != '\t')) {
              __src = (void *)(uVar15 + (long)pvVar11);
              goto LAB_0010ba8b;
            }
            uVar15 = uVar15 + 1;
            __n_00 = __n_00 - 1;
          } while (__n_00 != 0);
          __n_00 = 0;
          uVar15 = sVar7;
        }
LAB_0010ba8b:
        if (__n_00 != 0) {
          do {
            cVar2 = *(char *)((long)__src + (__n_00 - 1));
            if ((cVar2 != '\r') && (cVar2 != '\n')) goto LAB_0010baa7;
            __n_00 = __n_00 - 1;
          } while (__n_00 != 0);
          __n_00 = 0;
        }
LAB_0010baa7:
        lVar18 = curl_url();
        if (lVar18 == 0) {
          lVar18 = 0;
LAB_0010bb28:
          local_58 = (void *)0x0;
          goto LAB_0010bb32;
        }
        local_58 = malloc(__n_00 + 1);
        if (local_58 == (void *)0x0) goto LAB_0010bb28;
        memcpy(local_58,__src,__n_00);
        *(undefined1 *)((long)local_58 + __n_00) = 0;
        iVar5 = curl_easy_getinfo(uVar3,0x100001,&local_40);
        if (((((iVar5 != 0) || (iVar5 = curl_url_set(lVar18,0,local_40,0), iVar5 != 0)) ||
             (iVar5 = curl_url_set(lVar18,0,local_58,0), iVar5 != 0)) ||
            ((iVar5 = curl_url_get(lVar18,0,&local_50,2), iVar5 != 0 ||
             (iVar5 = curl_url_get(lVar18,1,&local_48,0), pcVar12 = local_48, iVar5 != 0)))) ||
           (((iVar5 = strcmp("http",local_48), iVar5 != 0 &&
             ((iVar5 = strcmp("https",pcVar12), iVar5 != 0 &&
              (iVar5 = strcmp("ftp",pcVar12), iVar5 != 0)))) &&
            (iVar5 = strcmp("ftps",pcVar12), iVar5 != 0)))) goto LAB_0010bb32;
        curl_mfprintf(pFVar14,"%.*s\x1b]8;;%s\x1b\\%.*s\x1b]8;;\x1b\\",uVar15 & 0xffffffff,pvVar11,
                      local_50,(int)sVar7 - (int)uVar15,__src);
      }
      else {
        local_58 = (void *)0x0;
        lVar13 = strtol(pcVar12,(char **)0x0,10);
        lVar18 = 0;
        if (0x12c0 < lVar13 - 1U) goto LAB_0010b9f3;
LAB_0010bb32:
        fwrite(pvVar11,sVar7,1,pFVar14);
      }
      if (lVar18 != 0) {
        curl_free(local_50);
        curl_free(local_48);
        curl_url_cleanup(lVar18);
        free(local_58);
      }
      bVar19 = true;
      goto LAB_0010bb77;
    }
    ptr = (char *)((long)pvVar11 + 1);
    pFVar14 = *(FILE **)((long)userdata + 0xe0);
    sVar7 = ~uVar15 + __n;
  }
  fwrite(ptr,sVar7,1,pFVar14);
  bVar19 = true;
LAB_0010bb77:
  if (bVar19) {
    return __n;
  }
  return unaff_R13;
}

Assistant:

size_t tool_header_cb(char *ptr, size_t size, size_t nmemb, void *userdata)
{
  struct per_transfer *per = userdata;
  struct HdrCbData *hdrcbdata = &per->hdrcbdata;
  struct OutStruct *outs = &per->outs;
  struct OutStruct *heads = &per->heads;
  struct OutStruct *etag_save = &per->etag_save;
  const char *str = ptr;
  const size_t cb = size * nmemb;
  const char *end = (char *)ptr + cb;
  const char *scheme = NULL;

  if(!per->config)
    return CURL_WRITEFUNC_ERROR;

#ifdef DEBUGBUILD
  if(size * nmemb > (size_t)CURL_MAX_HTTP_HEADER) {
    warnf(per->config->global, "Header data exceeds single call write limit");
    return CURL_WRITEFUNC_ERROR;
  }
#endif

#ifdef _WIN32
  /* Discard incomplete UTF-8 sequence buffered from body */
  if(outs->utf8seq[0])
    memset(outs->utf8seq, 0, sizeof(outs->utf8seq));
#endif

  /*
   * Write header data when curl option --dump-header (-D) is given.
   */

  if(per->config->headerfile && heads->stream) {
    size_t rc = fwrite(ptr, size, nmemb, heads->stream);
    if(rc != cb)
      return rc;
    /* flush the stream to send off what we got earlier */
    if(fflush(heads->stream)) {
      errorf(per->config->global, "Failed writing headers to %s",
             per->config->headerfile);
      return CURL_WRITEFUNC_ERROR;
    }
  }

  curl_easy_getinfo(per->curl, CURLINFO_SCHEME, &scheme);
  scheme = proto_token(scheme);
  if((scheme == proto_http || scheme == proto_https)) {
    long response = 0;
    curl_easy_getinfo(per->curl, CURLINFO_RESPONSE_CODE, &response);

    if((response/100 != 2) && (response/100 != 3))
      /* only care about etag and content-disposition headers in 2xx and 3xx
         responses */
      ;
    /*
     * Write etag to file when --etag-save option is given.
     */
    else if(per->config->etag_save_file && etag_save->stream &&
            /* match only header that start with etag (case insensitive) */
            checkprefix("etag:", str)) {
      const char *etag_h = &str[5];
      const char *eot = end - 1;
      if(*eot == '\n') {
        while(ISBLANK(*etag_h) && (etag_h < eot))
          etag_h++;
        while(ISSPACE(*eot))
          eot--;

        if(eot >= etag_h) {
          size_t etag_length = eot - etag_h + 1;
          /*
           * Truncate the etag save stream, it can have an existing etag value.
           */
#ifdef HAVE_FTRUNCATE
          if(ftruncate(fileno(etag_save->stream), 0)) {
            return CURL_WRITEFUNC_ERROR;
          }
#else
          if(fseek(etag_save->stream, 0, SEEK_SET)) {
            return CURL_WRITEFUNC_ERROR;
          }
#endif

          fwrite(etag_h, size, etag_length, etag_save->stream);
          /* terminate with newline */
          fputc('\n', etag_save->stream);
          (void)fflush(etag_save->stream);
        }
      }
    }

    /*
     * This callback sets the filename where output shall be written when
     * curl options --remote-name (-O) and --remote-header-name (-J) have
     * been simultaneously given and additionally server returns an HTTP
     * Content-Disposition header specifying a filename property.
     */

    else if(hdrcbdata->honor_cd_filename) {
      if((cb > 20) && checkprefix("Content-disposition:", str)) {
        const char *p = str + 20;

        /* look for the 'filename=' parameter
           (encoded filenames (*=) are not supported) */
        for(;;) {
          char *filename;
          size_t len;

          while((p < end) && *p && !ISALPHA(*p))
            p++;
          if(p > end - 9)
            break;

          if(memcmp(p, "filename=", 9)) {
            /* no match, find next parameter */
            while((p < end) && *p && (*p != ';'))
              p++;
            if((p < end) && *p)
              continue;
            else
              break;
          }
          p += 9;

          len = cb - (size_t)(p - str);
          filename = parse_filename(p, len);
          if(filename) {
            if(outs->stream) {
              /* indication of problem, get out! */
              free(filename);
              return CURL_WRITEFUNC_ERROR;
            }

            if(per->config->output_dir) {
              outs->filename = aprintf("%s/%s", per->config->output_dir,
                                       filename);
              free(filename);
              if(!outs->filename)
                return CURL_WRITEFUNC_ERROR;
            }
            else
              outs->filename = filename;

            outs->is_cd_filename = TRUE;
            outs->s_isreg = TRUE;
            outs->fopened = FALSE;
            outs->alloc_filename = TRUE;
            hdrcbdata->honor_cd_filename = FALSE; /* done now! */
            if(!tool_create_output_file(outs, per->config))
              return CURL_WRITEFUNC_ERROR;
            if(tool_write_headers(&per->hdrcbdata, outs->stream))
              return CURL_WRITEFUNC_ERROR;
          }
          break;
        }
        if(!outs->stream && !tool_create_output_file(outs, per->config))
          return CURL_WRITEFUNC_ERROR;
        if(tool_write_headers(&per->hdrcbdata, outs->stream))
          return CURL_WRITEFUNC_ERROR;
      } /* content-disposition handling */

      if(hdrcbdata->honor_cd_filename &&
         hdrcbdata->config->show_headers) {
        /* still awaiting the Content-Disposition header, store the header in
           memory. Since it is not zero terminated, we need an extra dance. */
        char *clone = aprintf("%.*s", (int)cb, (char *)str);
        if(clone) {
          struct curl_slist *old = hdrcbdata->headlist;
          hdrcbdata->headlist = curl_slist_append(old, clone);
          free(clone);
          if(!hdrcbdata->headlist) {
            curl_slist_free_all(old);
            return CURL_WRITEFUNC_ERROR;
          }
        }
        else {
          curl_slist_free_all(hdrcbdata->headlist);
          hdrcbdata->headlist = NULL;
          return CURL_WRITEFUNC_ERROR;
        }
        return cb; /* done for now */
      }
    }
  }
  if(hdrcbdata->config->writeout) {
    char *value = memchr(ptr, ':', cb);
    if(value) {
      if(per->was_last_header_empty)
        per->num_headers = 0;
      per->was_last_header_empty = FALSE;
      per->num_headers++;
    }
    else if(ptr[0] == '\r' || ptr[0] == '\n')
      per->was_last_header_empty = TRUE;
  }
  if(hdrcbdata->config->show_headers &&
    (scheme == proto_http || scheme == proto_https ||
     scheme == proto_rtsp || scheme == proto_file)) {
    /* bold headers only for selected protocols */
    char *value = NULL;

    if(!outs->stream && !tool_create_output_file(outs, per->config))
      return CURL_WRITEFUNC_ERROR;

    if(hdrcbdata->global->isatty &&
#ifdef _WIN32
       tool_term_has_bold &&
#endif
       hdrcbdata->global->styled_output)
      value = memchr(ptr, ':', cb);
    if(value) {
      size_t namelen = value - ptr;
      fprintf(outs->stream, BOLD "%.*s" BOLDOFF ":", (int)namelen, ptr);
#ifndef LINK
      fwrite(&value[1], cb - namelen - 1, 1, outs->stream);
#else
      if(curl_strnequal("Location", ptr, namelen)) {
        write_linked_location(per->curl, &value[1], cb - namelen - 1,
            outs->stream);
      }
      else
        fwrite(&value[1], cb - namelen - 1, 1, outs->stream);
#endif
    }
    else
      /* not "handled", just show it */
      fwrite(ptr, cb, 1, outs->stream);
  }
  return cb;
}